

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int debug_getupvalue(lua_State *L,int get)

{
  int32_t n_00;
  char *local_60;
  char *name;
  int32_t n;
  int get_local;
  lua_State *L_local;
  
  n_00 = lj_lib_checkint(L,2);
  lj_lib_checkfunc(L,1);
  if (get == 0) {
    local_60 = lua_setupvalue(L,1,n_00);
  }
  else {
    local_60 = lua_getupvalue(L,1,n_00);
  }
  if (local_60 == (char *)0x0) {
    L_local._4_4_ = 0;
  }
  else {
    lua_pushstring(L,local_60);
    if (get == 0) {
      L_local._4_4_ = 1;
    }
    else {
      *L->top = L->top[-2];
      L->top = L->top + 1;
      L_local._4_4_ = 2;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int debug_getupvalue(lua_State *L, int get)
{
  int32_t n = lj_lib_checkint(L, 2);
  const char *name;
  lj_lib_checkfunc(L, 1);
  name = get ? lua_getupvalue(L, 1, n) : lua_setupvalue(L, 1, n);
  if (name) {
    lua_pushstring(L, name);
    if (!get) return 1;
    copyTV(L, L->top, L->top-2);
    L->top++;
    return 2;
  }
  return 0;
}